

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-automation.cpp
# Opt level: O3

int main(void)

{
  test_basic_learn();
  test_slot_learn();
  test_midi_learn();
  test_macro_learn();
  test_learn_many();
  printf("# %d test(s) failed out of %d (currently passing %f%% tests)\n",
         100.0 - ((double)global_err * 100.0) / (double)test_counter);
  return (uint)(global_err != 0);
}

Assistant:

int main()
{
    test_basic_learn();
    test_slot_learn();
    test_midi_learn();
    test_macro_learn();
    test_learn_many();
    return test_summary();
}